

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::operator()(iterator *__return_storage_ptr__,
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
            *this,basic_string_view<wchar_t> value)

{
  char cVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  value_type_conflict vVar4;
  undefined4 uVar5;
  void *pvVar6;
  void *__buf;
  format_specs *spec;
  wchar_t *data;
  str_writer<wchar_t> local_30;
  
  __buf = (void *)value.size_;
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::write(&this->writer_,(int)value.data_,__buf,(size_t)__buf);
  }
  else {
    cVar1 = (spec->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_30,"invalid type specifier");
      spec = this->specs_;
    }
    pvVar6 = (void *)(long)(spec->super_core_format_specs).precision;
    local_30.size_ = (size_t)__buf;
    if (pvVar6 < __buf) {
      local_30.size_ = (size_t)pvVar6;
    }
    if ((long)pvVar6 < 0) {
      local_30.size_ = (size_t)__buf;
    }
    local_30.s = value.data_;
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                *)this,&spec->super_align_spec,&local_30);
  }
  pwVar2 = (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.out_;
  sVar3 = (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.limit_;
  vVar4 = (this->writer_).out_.blackhole_;
  uVar5 = *(undefined4 *)&(this->writer_).out_.field_0x1c;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ =
       (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.count_;
  __return_storage_ptr__->blackhole_ = vVar4;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar5;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar2;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sVar3;
  return __return_storage_ptr__;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }